

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::GetInstallObjectNames
          (cmInstallTargetGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objects)

{
  pointer pbVar1;
  pointer this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_c0;
  string *local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_98;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  size_type local_68;
  pointer local_60;
  undefined8 local_58;
  string local_50;
  
  local_a0 = config;
  cmGeneratorTarget::GetTargetObjectNames(this->Target,config,objects);
  this_00 = (objects->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (objects->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pbVar1) {
    do {
      anon_unknown.dwarf_2b0d9cd::computeInstallObjectDir(&local_c0,this->Target,local_a0);
      local_98.first._M_len = local_c0._M_string_length;
      local_98.first._M_str = local_c0._M_dataplus._M_p;
      local_80 = 1;
      local_78 = "/";
      local_70 = 0;
      local_60 = (this_00->_M_dataplus)._M_p;
      local_68 = this_00->_M_string_length;
      local_58 = 0;
      views._M_len = 3;
      views._M_array = &local_98;
      local_98.second = &local_c0;
      cmCatViews(&local_50,views);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pbVar1);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::GetInstallObjectNames(
  std::string const& config, std::vector<std::string>& objects) const
{
  this->Target->GetTargetObjectNames(config, objects);
  for (std::string& o : objects) {
    o = cmStrCat(computeInstallObjectDir(this->Target, config), "/", o);
  }
}